

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

opStatus __thiscall
llvm::detail::IEEEFloat::convertToSignExtendedInteger
          (IEEEFloat *this,MutableArrayRef<unsigned_long> parts,uint width,bool isSigned,
          roundingMode rounding_mode,bool *isExact)

{
  short sVar1;
  byte bVar2;
  bool bVar3;
  lostFraction lost_fraction;
  uint uVar4;
  WordType WVar5;
  Significand *src;
  opStatus oVar6;
  uint srcBits;
  WordType *dst;
  uint uVar7;
  uint parts_00;
  bool bVar8;
  
  dst = parts.super_ArrayRef<unsigned_long>.Data;
  *isExact = false;
  bVar2 = this->field_0x12 & 7;
  if (bVar2 < 2) {
    return opInvalidOp;
  }
  parts_00 = width + 0x3f >> 6;
  if (parts.super_ArrayRef<unsigned_long>.Length < (ulong)parts_00) {
    __assert_fail("dstPartsCount <= parts.size() && \"Integer too big\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x802,
                  "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertToSignExtendedInteger(MutableArrayRef<integerPart>, unsigned int, bool, roundingMode, bool *) const"
                 );
  }
  if (bVar2 == 3) {
    APInt::tcSet(dst,0,parts_00);
    bVar8 = (this->field_0x12 & 8) == 0;
    goto LAB_00165382;
  }
  uVar4 = this->semantics->precision;
  if (uVar4 - 0x40 < 0xffffff80) {
    src = (Significand *)(this->significand).parts;
  }
  else {
    src = &this->significand;
  }
  sVar1 = this->exponent;
  if (sVar1 < 0) {
    APInt::tcSet(dst,0,parts_00);
    uVar7 = ~(int)this->exponent + this->semantics->precision;
LAB_0016541c:
    bVar3 = true;
    if ((uVar7 != 0) &&
       (lost_fraction =
             lostFractionThroughTruncation(&src->part,this->semantics->precision + 0x40 >> 6,uVar7),
       lost_fraction != lfExactlyZero)) {
      bVar3 = roundAwayFromZero(this,rounding_mode,lost_fraction,uVar7);
      if ((bVar3) && (WVar5 = APInt::tcAddPart(dst,1,parts_00), WVar5 != 0)) {
        return opInvalidOp;
      }
      bVar3 = false;
    }
  }
  else {
    if (width <= (uint)(int)sVar1) {
      return opInvalidOp;
    }
    srcBits = (int)sVar1 + 1;
    uVar7 = uVar4 - srcBits;
    if (srcBits <= uVar4 && uVar7 != 0) {
      APInt::tcExtract(dst,parts_00,&src->part,srcBits,uVar7);
      goto LAB_0016541c;
    }
    APInt::tcExtract(dst,parts_00,&src->part,uVar4,0);
    APInt::tcShiftLeft(dst,parts_00,srcBits - this->semantics->precision);
    bVar3 = true;
  }
  uVar7 = APInt::tcMSB(dst,parts_00);
  uVar4 = uVar7 + 1;
  if ((this->field_0x12 & 8) == 0) {
    bVar8 = uVar4 < !isSigned + width;
    oVar6 = opInvalidOp;
    if (bVar8) {
      oVar6 = opInexact;
    }
    bVar3 = (bool)(bVar8 & bVar3);
  }
  else {
    if (isSigned) {
      if (uVar4 == width) {
        uVar4 = APInt::tcLSB(dst,parts_00);
        if (uVar4 != uVar7) {
          return opInvalidOp;
        }
      }
      else if (width < uVar4) {
        return opInvalidOp;
      }
    }
    else if (uVar7 != 0xffffffff) {
      return opInvalidOp;
    }
    APInt::tcNegate(dst,parts_00);
    oVar6 = opInexact;
  }
  bVar8 = true;
  if (!bVar3) {
    return oVar6;
  }
LAB_00165382:
  *isExact = bVar8;
  return opOK;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::convertToSignExtendedInteger(
    MutableArrayRef<integerPart> parts, unsigned int width, bool isSigned,
    roundingMode rounding_mode, bool *isExact) const {
  lostFraction lost_fraction;
  const integerPart *src;
  unsigned int dstPartsCount, truncatedBits;

  *isExact = false;

  /* Handle the three special cases first.  */
  if (category == fcInfinity || category == fcNaN)
    return opInvalidOp;

  dstPartsCount = partCountForBits(width);
  assert(dstPartsCount <= parts.size() && "Integer too big");

  if (category == fcZero) {
    APInt::tcSet(parts.data(), 0, dstPartsCount);
    // Negative zero can't be represented as an int.
    *isExact = !sign;
    return opOK;
  }

  src = significandParts();

  /* Step 1: place our absolute value, with any fraction truncated, in
     the destination.  */
  if (exponent < 0) {
    /* Our absolute value is less than one; truncate everything.  */
    APInt::tcSet(parts.data(), 0, dstPartsCount);
    /* For exponent -1 the integer bit represents .5, look at that.
       For smaller exponents leftmost truncated bit is 0. */
    truncatedBits = semantics->precision -1U - exponent;
  } else {
    /* We want the most significant (exponent + 1) bits; the rest are
       truncated.  */
    unsigned int bits = exponent + 1U;

    /* Hopelessly large in magnitude?  */
    if (bits > width)
      return opInvalidOp;

    if (bits < semantics->precision) {
      /* We truncate (semantics->precision - bits) bits.  */
      truncatedBits = semantics->precision - bits;
      APInt::tcExtract(parts.data(), dstPartsCount, src, bits, truncatedBits);
    } else {
      /* We want at least as many bits as are available.  */
      APInt::tcExtract(parts.data(), dstPartsCount, src, semantics->precision,
                       0);
      APInt::tcShiftLeft(parts.data(), dstPartsCount,
                         bits - semantics->precision);
      truncatedBits = 0;
    }
  }

  /* Step 2: work out any lost fraction, and increment the absolute
     value if we would round away from zero.  */
  if (truncatedBits) {
    lost_fraction = lostFractionThroughTruncation(src, partCount(),
                                                  truncatedBits);
    if (lost_fraction != lfExactlyZero &&
        roundAwayFromZero(rounding_mode, lost_fraction, truncatedBits)) {
      if (APInt::tcIncrement(parts.data(), dstPartsCount))
        return opInvalidOp;     /* Overflow.  */
    }
  } else {
    lost_fraction = lfExactlyZero;
  }

  /* Step 3: check if we fit in the destination.  */
  unsigned int omsb = APInt::tcMSB(parts.data(), dstPartsCount) + 1;

  if (sign) {
    if (!isSigned) {
      /* Negative numbers cannot be represented as unsigned.  */
      if (omsb != 0)
        return opInvalidOp;
    } else {
      /* It takes omsb bits to represent the unsigned integer value.
         We lose a bit for the sign, but care is needed as the
         maximally negative integer is a special case.  */
      if (omsb == width &&
          APInt::tcLSB(parts.data(), dstPartsCount) + 1 != omsb)
        return opInvalidOp;

      /* This case can happen because of rounding.  */
      if (omsb > width)
        return opInvalidOp;
    }

    APInt::tcNegate (parts.data(), dstPartsCount);
  } else {
    if (omsb >= width + !isSigned)
      return opInvalidOp;
  }

  if (lost_fraction == lfExactlyZero) {
    *isExact = true;
    return opOK;
  } else
    return opInexact;
}